

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.test.cpp
# Opt level: O1

bool __thiscall
EqualsRange<FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::match(EqualsRange<FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *this,FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *in)

{
  int iVar1;
  bool bVar2;
  ostringstream s;
  undefined1 *local_1b0;
  size_t local_1a8;
  undefined1 local_1a0 [16];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  ::operator<<((ostream *)local_190,in);
  std::__cxx11::stringbuf::str();
  if (local_1a8 == (this->expected_)._M_string_length) {
    if (local_1a8 == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_1b0,(this->expected_)._M_dataplus._M_p,local_1a8);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return bVar2;
}

Assistant:

virtual bool match(const T& in) const override {
        std::ostringstream s;
        s << in;
        return s.str() == expected_;
    }